

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O2

bool __thiscall Jupiter::Timer::removeFromList(Timer *this)

{
  list<Jupiter::Timer_*,_std::allocator<Jupiter::Timer_*>_> *__position;
  
  __position = &o_timers_abi_cxx11_;
  do {
    __position = (list<Jupiter::Timer_*,_std::allocator<Jupiter::Timer_*>_> *)
                 ((_List_node_base *)__position)->_M_next;
    if (__position == &o_timers_abi_cxx11_) goto LAB_001484b8;
  } while ((Timer *)((_List_node_base *)((long)__position + 0x10))->_M_next != this);
  std::__cxx11::list<Jupiter::Timer_*,_std::allocator<Jupiter::Timer_*>_>::erase
            (&o_timers_abi_cxx11_,(const_iterator)__position);
LAB_001484b8:
  return __position != &o_timers_abi_cxx11_;
}

Assistant:

bool Jupiter::Timer::removeFromList()
{
	for (auto node = o_timers.begin(); node != o_timers.end(); ++node)
	{
		if (*node == this)
		{
			o_timers.erase(node);
			return true;
		}
	}

	return false;
}